

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * lua_pushlstring(lua_State *L,char *s,size_t len)

{
  StkId pTVar1;
  TString *x_;
  GCObject *pGVar2;
  
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  pGVar2 = (GCObject *)luaS_newlstr(L,s,len);
  pTVar1 = L->top;
  (pTVar1->value_).gc = pGVar2;
  pTVar1->tt_ = (pGVar2->gch).tt | 0x40;
  L->top = L->top + 1;
  return (char *)(&pGVar2->ts + 1);
}

Assistant:

LUA_API const char *lua_pushlstring (lua_State *L, const char *s, size_t len) {
  TString *ts;
  lua_lock(L);
  luaC_checkGC(L);
  ts = luaS_newlstr(L, s, len);
  setsvalue2s(L, L->top, ts);
  api_incr_top(L);
  lua_unlock(L);
  return getstr(ts);
}